

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON_Utils.c
# Opt level: O3

int compare_strings(uchar *string1,uchar *string2,cJSON_bool case_sensitive)

{
  __int32_t *p_Var1;
  int iVar2;
  __int32_t **pp_Var3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  
  iVar2 = 1;
  if ((string2 != (uchar *)0x0 && string1 != (uchar *)0x0) && (iVar2 = 0, string1 != string2)) {
    if (case_sensitive != 0) {
      iVar2 = strcmp((char *)string1,(char *)string2);
      return iVar2;
    }
    pp_Var3 = __ctype_tolower_loc();
    p_Var1 = *pp_Var3;
    uVar4 = (ulong)*string1;
    iVar2 = p_Var1[uVar4];
    iVar6 = p_Var1[*string2];
    if (iVar2 == iVar6) {
      lVar5 = 1;
      do {
        if ((char)uVar4 == '\0') {
          return 0;
        }
        uVar4 = (ulong)string1[lVar5];
        iVar2 = p_Var1[uVar4];
        iVar6 = p_Var1[string2[lVar5]];
        lVar5 = lVar5 + 1;
      } while (iVar2 == iVar6);
    }
    iVar2 = iVar2 - iVar6;
  }
  return iVar2;
}

Assistant:

static int compare_strings(const unsigned char *string1, const unsigned char *string2, const cJSON_bool case_sensitive)
{
    if ((string1 == NULL) || (string2 == NULL))
    {
        return 1;
    }

    if (string1 == string2)
    {
        return 0;
    }

    if (case_sensitive)
    {
        return strcmp((const char*)string1, (const char*)string2);
    }

    for(; tolower(*string1) == tolower(*string2); (void)string1++, string2++)
    {
        if (*string1 == '\0')
        {
            return 0;
        }
    }

    return tolower(*string1) - tolower(*string2);
}